

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

TilePipelineDesc * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetTilePipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  GraphicsPipelineData *pGVar1;
  char (*in_RCX) [31];
  string msg;
  string local_30;
  
  CheckPipelineReady(this);
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      ).m_Desc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[30]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsTilePipeline()",(char (*) [30])in_RCX);
    in_RCX = (char (*) [31])0x21c;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetTilePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x21c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  if (pGVar1 == (GraphicsPipelineData *)0x0) {
    FormatString<char[26],char[31]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pTilePipelineData != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetTilePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x21d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  }
  return (TilePipelineDesc *)pGVar1;
}

Assistant:

GetTilePipelineDesc() const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsTilePipeline());
        VERIFY_EXPR(m_pTilePipelineData != nullptr);
        return m_pTilePipelineData->Desc;
    }